

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

void av1_first_pass(AV1_COMP *cpi,int64_t ts_duration)

{
  long lVar1;
  long lVar2;
  BLOCK_SIZE fp_block_size_00;
  int iVar3;
  int iVar4;
  int iVar5;
  AV1_COMMON *cm_00;
  long lVar6;
  long *in_RDI;
  double dVar7;
  int in_stack_00000038;
  int in_stack_0000003c;
  YV12_BUFFER_CONFIG *in_stack_00000040;
  FIRSTPASS_STATS *this_frame_stats;
  int num_mbs;
  int num_mbs_16X16;
  TWO_PASS *twopass;
  double raw_err_stdev;
  int total_raw_motion_err_count;
  FRAME_STATS stats;
  YV12_BUFFER_CONFIG *this_frame;
  YV12_BUFFER_CONFIG *golden_frame;
  YV12_BUFFER_CONFIG *last_frame;
  int tile_rows;
  int tile_cols;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  MultiThreadInfo *mt_info;
  FRAME_STATS *mb_stats;
  int *raw_motion_err_list;
  int unit_cols;
  int unit_rows;
  int max_mi_rows;
  int max_mi_cols;
  int max_mb_cols;
  int max_mb_rows;
  BLOCK_SIZE fp_block_size;
  FeatureFlags *features;
  int ref_frame_flags_backup;
  int qindex;
  MACROBLOCKD *xd;
  int num_planes;
  SequenceHeader *seq_params;
  CurrentFrame *current_frame;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  MACROBLOCK *x;
  FeatureFlags *in_stack_000002d8;
  AV1_COMP *in_stack_000002e0;
  int in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  MACROBLOCKD *in_stack_fffffffffffffe38;
  long *plVar8;
  AV1_COMP *in_stack_fffffffffffffe40;
  RefCntBuffer **ppRVar9;
  int *in_stack_fffffffffffffe48;
  AV1_COMMON *pAVar10;
  AV1_COMP *in_stack_fffffffffffffe50;
  AV1_COMP *pAVar11;
  undefined8 in_stack_fffffffffffffe58;
  AV1_COMP *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  AV1_COMMON *in_stack_fffffffffffffe70;
  MACROBLOCK *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  macroblockd_plane *in_stack_fffffffffffffe88;
  int idx;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int iStack_15c;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  undefined8 in_stack_fffffffffffffeb8;
  AV1_COMP *in_stack_fffffffffffffec0;
  BLOCK_SIZE fp_block_size_01;
  YV12_BUFFER_CONFIG *pYVar12;
  int iVar13;
  FRAME_STATS *stats_00;
  int local_64;
  int local_60;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x77f0);
  av1_num_planes(cm_00);
  find_fp_qindex(0);
  lVar2 = in_RDI[0xc117];
  *(undefined4 *)(in_RDI + 0xc117) = 9;
  iVar3 = frame_is_intra_only(cm_00);
  if (iVar3 != 0) {
    in_RDI[0x2e1d] = in_RDI[0x84f5];
    av1_set_screen_content_options(in_stack_000002e0,in_stack_000002d8);
  }
  av1_set_speed_features_framesize_independent
            (in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  fp_block_size_00 = get_fp_block_size(*(int *)((long)in_RDI + 0x9d2fc));
  local_60 = (int)in_RDI[0x7831];
  local_64 = *(int *)((long)in_RDI + 0x3c18c);
  if ((int)in_RDI[0x8468] != 0) {
    iVar3 = size_in_mi((int)in_RDI[0x8468]);
    local_64 = iVar3 + 2 >> 2;
  }
  if (*(int *)((long)in_RDI + 0x42344) != 0) {
    iVar3 = size_in_mi(*(int *)((long)in_RDI + 0x42344));
    local_60 = iVar3 + 2 >> 2;
  }
  get_unit_rows(fp_block_size_00,local_60);
  get_unit_cols(fp_block_size_00,local_64);
  *(BLOCK_SIZE *)((long)in_RDI + 0x9d514) = fp_block_size_00;
  setup_firstpass_data
            ((AV1_COMMON *)in_stack_fffffffffffffe40,(FirstPassData *)in_stack_fffffffffffffe38,
             in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
  pAVar11 = (AV1_COMP *)(in_RDI + 0x135c9);
  stats_00 = (FRAME_STATS *)(in_RDI + 0x135d3);
  iVar3 = (int)in_RDI[0x8404];
  iVar13 = *(int *)((long)in_RDI + 0x42024);
  if ((int)in_RDI[0xe264] < iVar3 * iVar13) {
    av1_alloc_tile_data(in_stack_fffffffffffffe50);
  }
  av1_init_tile_data((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  iStack_15c = 0;
  pYVar12 = (YV12_BUFFER_CONFIG *)0x0;
  iVar4 = frame_is_intra_only(cm_00);
  if (iVar4 == 0) {
    av1_scale_references
              (in_stack_fffffffffffffec0,(InterpFilter)((ulong)in_stack_fffffffffffffeb8 >> 0x38),
               (int)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
    get_ref_scale_factors_const
              ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (MV_REFERENCE_FRAME)((uint)in_stack_fffffffffffffe2c >> 0x18));
    iVar4 = av1_is_scaled((scale_factors *)
                          CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    if (iVar4 == 0) {
      pYVar12 = get_ref_frame_yv12_buf
                          ((AV1_COMMON *)in_stack_fffffffffffffe40,
                           (MV_REFERENCE_FRAME)((ulong)in_stack_fffffffffffffe38 >> 0x38));
      iStack_15c = (int)((ulong)pYVar12 >> 0x20);
    }
    else {
      pYVar12 = av1_get_scaled_ref_frame
                          (in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20)
                          );
      iStack_15c = (int)((ulong)pYVar12 >> 0x20);
    }
    get_ref_scale_factors_const
              ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (MV_REFERENCE_FRAME)((uint)in_stack_fffffffffffffe2c >> 0x18));
    iVar4 = av1_is_scaled((scale_factors *)
                          CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    if (iVar4 == 0) {
      pYVar12 = get_ref_frame_yv12_buf
                          ((AV1_COMMON *)in_stack_fffffffffffffe40,
                           (MV_REFERENCE_FRAME)((ulong)in_stack_fffffffffffffe38 >> 0x38));
    }
    else {
      pYVar12 = av1_get_scaled_ref_frame
                          (in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20)
                          );
    }
  }
  fp_block_size_01 = (BLOCK_SIZE)((ulong)(in_RDI[0x780d] + 0x4e0) >> 0x38);
  av1_setup_frame_size(in_stack_fffffffffffffe50);
  av1_set_mv_search_params(in_stack_fffffffffffffe50);
  set_mi_offsets((CommonModeInfoParams *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
  **(BLOCK_SIZE **)in_RDI[0x2e11] = fp_block_size_00;
  *(undefined4 *)((long)in_RDI + 0x6079c) = 0x7fffffff;
  iVar4 = (int)in_RDI[0x84d3];
  av1_set_quantizer(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                    (int)in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                    (int)in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                    SUB81((ulong)in_stack_fffffffffffffe58 >> 0x18,0),
                    (aom_tune_metric)in_stack_fffffffffffffe88);
  av1_setup_block_planes
            ((MACROBLOCKD *)in_stack_fffffffffffffe40,
             (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
             in_stack_fffffffffffffe34);
  av1_setup_src_planes
            (in_stack_fffffffffffffe78,(YV12_BUFFER_CONFIG *)in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),(int)in_stack_fffffffffffffe68,
             (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
             (BLOCK_SIZE)((ulong)in_stack_fffffffffffffe60 >> 0x18));
  av1_setup_dst_planes
            (in_stack_fffffffffffffe88,(BLOCK_SIZE)((uint)in_stack_fffffffffffffe84 >> 0x18),
             (YV12_BUFFER_CONFIG *)in_stack_fffffffffffffe78,
             (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),(int)in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),in_stack_fffffffffffffeb0);
  idx = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  iVar5 = frame_is_intra_only(cm_00);
  if (iVar5 == 0) {
    av1_setup_pre_planes
              ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),idx,
               (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),(int)in_stack_fffffffffffffe78,
               (scale_factors *)in_stack_fffffffffffffe70,in_stack_fffffffffffffeb0);
  }
  set_mi_offsets((CommonModeInfoParams *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 in_stack_fffffffffffffe34,iVar4);
  iVar5 = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  *(undefined4 *)(in_RDI + 0x3190) = 0;
  av1_frame_init_quantizer((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe34,iVar4));
  av1_default_coef_probs((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe34,iVar4));
  av1_init_mode_probs((FRAME_CONTEXT *)CONCAT44(in_stack_fffffffffffffe34,iVar4));
  av1_init_mv_probs((AV1_COMMON *)0x25daea);
  av1_initialize_rd_consts(in_stack_fffffffffffffec0);
  *(code **)&stats_00[2].new_mv_count = av1_row_mt_sync_read_dummy;
  *(code **)&stats_00[2].sum_mvr = av1_row_mt_sync_write_dummy;
  if (*(int *)&pAVar11->ppi < 2) {
    first_pass_tiles(in_stack_fffffffffffffe50,
                     (BLOCK_SIZE)((ulong)in_stack_fffffffffffffe48 >> 0x38));
  }
  else {
    *(code **)&stats_00[2].new_mv_count = av1_row_mt_sync_read;
    *(code **)&stats_00[2].sum_mvr = av1_row_mt_sync_write;
    av1_fp_encode_tiles_row_mt
              ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  accumulate_frame_stats
            ((FRAME_STATS *)in_stack_fffffffffffffec0,
             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8);
  frame_is_intra_only(cm_00);
  raw_motion_error_stdev(in_stack_fffffffffffffe48,iVar5);
  av1_free_firstpass_data((FirstPassData *)0x25dc0c);
  av1_num_planes(cm_00);
  av1_dealloc_src_diff_buf
            ((macroblock *)CONCAT44(in_stack_fffffffffffffe34,iVar4),in_stack_fffffffffffffe2c);
  lVar6 = *in_RDI + 0x5bc0;
  if ((char)in_RDI[0x8481] == '\0') {
    iVar5 = (int)in_RDI[0x7832];
  }
  else {
    iVar5 = *(int *)((long)in_RDI + 0x712fc);
  }
  get_num_mbs(fp_block_size_00,iVar5);
  lVar1 = *(long *)(*(long *)(lVar6 + 0x198) + 8);
  update_firstpass_stats
            (pAVar11,stats_00,(double)CONCAT44(iVar3,iVar13),iStack_15c,(int64_t)pYVar12,
             fp_block_size_01);
  if (*(int *)(lVar6 + 0x2f58) < 4) {
    if (((int)in_RDI[0x77f2] != 0) && (0.2 < *(double *)(lVar1 + 0x30))) {
      if (0.0 < *(double *)(lVar1 + 0x20) || *(double *)(lVar1 + 0x20) == 0.0) {
        dVar7 = *(double *)(lVar1 + 0x20) + 1e-06;
      }
      else {
        dVar7 = *(double *)(lVar1 + 0x20) - 1e-06;
      }
      if (2.0 < *(double *)(lVar1 + 0x10) / dVar7) goto LAB_0025deab;
    }
    *(int *)(lVar6 + 0x2f58) = *(int *)(lVar6 + 0x2f58) + 1;
  }
  else {
LAB_0025deab:
    if (pYVar12 != (YV12_BUFFER_CONFIG *)0x0) {
      plVar8 = in_RDI + 0x7824;
      iVar3 = get_ref_frame_map_idx(cm_00,'\x04');
      ppRVar9 = (RefCntBuffer **)(plVar8 + iVar3);
      pAVar10 = cm_00;
      iVar3 = get_ref_frame_map_idx(cm_00,'\x01');
      assign_frame_buffer_p(ppRVar9,pAVar10->ref_frame_map[iVar3]);
    }
    *(undefined4 *)(lVar6 + 0x2f58) = 1;
  }
  aom_extend_frame_borders_c
            ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_fffffffffffffe34,iVar4),
             in_stack_fffffffffffffe2c);
  pAVar11 = (AV1_COMP *)(in_RDI + 0x7824);
  iVar3 = get_ref_frame_map_idx(cm_00,'\x01');
  assign_frame_buffer_p
            ((RefCntBuffer **)
             ((long)((pAVar11->enc_quant_dequant_params).quants.y_quant + -1) + (long)iVar3 * 8),
             (RefCntBuffer *)in_RDI[0x780d]);
  if (((int)in_RDI[0x77f2] == 0) && (iVar3 = get_ref_frame_map_idx(cm_00,'\x04'), iVar3 != -1)) {
    plVar8 = in_RDI + 0x7824;
    iVar3 = get_ref_frame_map_idx(cm_00,'\x04');
    ppRVar9 = (RefCntBuffer **)(plVar8 + iVar3);
    pAVar10 = cm_00;
    iVar3 = get_ref_frame_map_idx(cm_00,'\x01');
    assign_frame_buffer_p(ppRVar9,pAVar10->ref_frame_map[iVar3]);
  }
  print_reconstruction_frame(in_stack_00000040,in_stack_0000003c,in_stack_00000038);
  *(int *)(in_RDI + 0x77f2) = (int)in_RDI[0x77f2] + 1;
  *(int *)(in_RDI + 0xc117) = (int)lVar2;
  iVar3 = frame_is_intra_only(cm_00);
  if (iVar3 == 0) {
    release_scaled_references(pAVar11);
  }
  return;
}

Assistant:

void av1_first_pass(AV1_COMP *cpi, const int64_t ts_duration) {
  MACROBLOCK *const x = &cpi->td.mb;
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  CurrentFrame *const current_frame = &cm->current_frame;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  const int qindex = find_fp_qindex(seq_params->bit_depth);
  const int ref_frame_flags_backup = cpi->ref_frame_flags;
  cpi->ref_frame_flags = av1_ref_frame_flag_list[LAST_FRAME] |
                         av1_ref_frame_flag_list[GOLDEN_FRAME];

  // Detect if the key frame is screen content type.
  if (frame_is_intra_only(cm)) {
    FeatureFlags *const features = &cm->features;
    assert(cpi->source != NULL);
    xd->cur_buf = cpi->source;
    av1_set_screen_content_options(cpi, features);
  }

  // Prepare the speed features
  av1_set_speed_features_framesize_independent(cpi, cpi->oxcf.speed);

  // Unit size for the first pass encoding.
  const BLOCK_SIZE fp_block_size =
      get_fp_block_size(cpi->is_screen_content_type);

  int max_mb_rows = mi_params->mb_rows;
  int max_mb_cols = mi_params->mb_cols;
  if (cpi->oxcf.frm_dim_cfg.forced_max_frame_width) {
    int max_mi_cols = size_in_mi(cpi->oxcf.frm_dim_cfg.forced_max_frame_width);
    max_mb_cols = ROUND_POWER_OF_TWO(max_mi_cols, 2);
  }
  if (cpi->oxcf.frm_dim_cfg.forced_max_frame_height) {
    int max_mi_rows = size_in_mi(cpi->oxcf.frm_dim_cfg.forced_max_frame_height);
    max_mb_rows = ROUND_POWER_OF_TWO(max_mi_rows, 2);
  }

  // Number of rows in the unit size.
  // Note max_mb_rows and max_mb_cols are in the unit of 16x16.
  const int unit_rows = get_unit_rows(fp_block_size, max_mb_rows);
  const int unit_cols = get_unit_cols(fp_block_size, max_mb_cols);

  // Set fp_block_size, for the convenience of multi-thread usage.
  cpi->fp_block_size = fp_block_size;

  setup_firstpass_data(cm, &cpi->firstpass_data, unit_rows, unit_cols);
  int *raw_motion_err_list = cpi->firstpass_data.raw_motion_err_list;
  FRAME_STATS *mb_stats = cpi->firstpass_data.mb_stats;

  // multi threading info
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;

  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  if (cpi->allocated_tiles < tile_cols * tile_rows) {
    av1_alloc_tile_data(cpi);
  }

  av1_init_tile_data(cpi);

  const YV12_BUFFER_CONFIG *last_frame = NULL;
  const YV12_BUFFER_CONFIG *golden_frame = NULL;
  if (!frame_is_intra_only(cm)) {
    av1_scale_references(cpi, EIGHTTAP_REGULAR, 0, 0);
    last_frame = av1_is_scaled(get_ref_scale_factors_const(cm, LAST_FRAME))
                     ? av1_get_scaled_ref_frame(cpi, LAST_FRAME)
                     : get_ref_frame_yv12_buf(cm, LAST_FRAME);
    golden_frame = av1_is_scaled(get_ref_scale_factors_const(cm, GOLDEN_FRAME))
                       ? av1_get_scaled_ref_frame(cpi, GOLDEN_FRAME)
                       : get_ref_frame_yv12_buf(cm, GOLDEN_FRAME);
  }

  YV12_BUFFER_CONFIG *const this_frame = &cm->cur_frame->buf;
  // First pass code requires valid last and new frame buffers.
  assert(this_frame != NULL);
  assert(frame_is_intra_only(cm) || (last_frame != NULL));

  av1_setup_frame_size(cpi);
  av1_set_mv_search_params(cpi);

  set_mi_offsets(mi_params, xd, 0, 0);
  xd->mi[0]->bsize = fp_block_size;

  // Do not use periodic key frames.
  cpi->rc.frames_to_key = INT_MAX;

  av1_set_quantizer(
      cm, cpi->oxcf.q_cfg.qm_minlevel, cpi->oxcf.q_cfg.qm_maxlevel, qindex,
      cpi->oxcf.q_cfg.enable_chroma_deltaq, cpi->oxcf.q_cfg.enable_hdr_deltaq,
      cpi->oxcf.mode == ALLINTRA, cpi->oxcf.tune_cfg.tuning);

  av1_setup_block_planes(xd, seq_params->subsampling_x,
                         seq_params->subsampling_y, num_planes);

  av1_setup_src_planes(x, cpi->source, 0, 0, num_planes, fp_block_size);
  av1_setup_dst_planes(xd->plane, seq_params->sb_size, this_frame, 0, 0, 0,
                       num_planes);

  if (!frame_is_intra_only(cm)) {
    av1_setup_pre_planes(xd, 0, last_frame, 0, 0, NULL, num_planes);
  }

  set_mi_offsets(mi_params, xd, 0, 0);

  // Don't store luma on the fist pass since chroma is not computed
  xd->cfl.store_y = 0;
  av1_frame_init_quantizer(cpi);

  av1_default_coef_probs(cm);
  av1_init_mode_probs(cm->fc);
  av1_init_mv_probs(cm);
  av1_initialize_rd_consts(cpi);

  enc_row_mt->sync_read_ptr = av1_row_mt_sync_read_dummy;
  enc_row_mt->sync_write_ptr = av1_row_mt_sync_write_dummy;

  if (mt_info->num_workers > 1) {
    enc_row_mt->sync_read_ptr = av1_row_mt_sync_read;
    enc_row_mt->sync_write_ptr = av1_row_mt_sync_write;
    av1_fp_encode_tiles_row_mt(cpi);
  } else {
    first_pass_tiles(cpi, fp_block_size);
  }

  FRAME_STATS stats = accumulate_frame_stats(mb_stats, unit_rows, unit_cols);
  int total_raw_motion_err_count =
      frame_is_intra_only(cm) ? 0 : unit_rows * unit_cols;
  const double raw_err_stdev =
      raw_motion_error_stdev(raw_motion_err_list, total_raw_motion_err_count);
  av1_free_firstpass_data(&cpi->firstpass_data);
  av1_dealloc_src_diff_buf(&cpi->td.mb, av1_num_planes(cm));

  // Clamp the image start to rows/2. This number of rows is discarded top
  // and bottom as dead data so rows / 2 means the frame is blank.
  if ((stats.image_data_start_row > unit_rows / 2) ||
      (stats.image_data_start_row == INVALID_ROW)) {
    stats.image_data_start_row = unit_rows / 2;
  }
  // Exclude any image dead zone
  if (stats.image_data_start_row > 0) {
    stats.intra_skip_count =
        AOMMAX(0, stats.intra_skip_count -
                      (stats.image_data_start_row * unit_cols * 2));
  }

  TWO_PASS *twopass = &cpi->ppi->twopass;
  const int num_mbs_16X16 = (cpi->oxcf.resize_cfg.resize_mode != RESIZE_NONE)
                                ? cpi->initial_mbs
                                : mi_params->MBs;
  // Number of actual units used in the first pass, it can be other square
  // block sizes than 16X16.
  const int num_mbs = get_num_mbs(fp_block_size, num_mbs_16X16);
  stats.intra_factor = stats.intra_factor / (double)num_mbs;
  stats.brightness_factor = stats.brightness_factor / (double)num_mbs;
  FIRSTPASS_STATS *this_frame_stats = twopass->stats_buf_ctx->stats_in_end;
  update_firstpass_stats(cpi, &stats, raw_err_stdev,
                         current_frame->frame_number, ts_duration,
                         fp_block_size);

  // Copy the previous Last Frame back into gf buffer if the prediction is good
  // enough... but also don't allow it to lag too far.
  if ((twopass->sr_update_lag > 3) ||
      ((current_frame->frame_number > 0) &&
       (this_frame_stats->pcnt_inter > 0.20) &&
       ((this_frame_stats->intra_error /
         DOUBLE_DIVIDE_CHECK(this_frame_stats->coded_error)) > 2.0))) {
    if (golden_frame != NULL) {
      assign_frame_buffer_p(
          &cm->ref_frame_map[get_ref_frame_map_idx(cm, GOLDEN_FRAME)],
          cm->ref_frame_map[get_ref_frame_map_idx(cm, LAST_FRAME)]);
    }
    twopass->sr_update_lag = 1;
  } else {
    ++twopass->sr_update_lag;
  }

  aom_extend_frame_borders(this_frame, num_planes);

  // The frame we just compressed now becomes the last frame.
  assign_frame_buffer_p(
      &cm->ref_frame_map[get_ref_frame_map_idx(cm, LAST_FRAME)], cm->cur_frame);

  // Special case for the first frame. Copy into the GF buffer as a second
  // reference.
  if (current_frame->frame_number == 0 &&
      get_ref_frame_map_idx(cm, GOLDEN_FRAME) != INVALID_IDX) {
    assign_frame_buffer_p(
        &cm->ref_frame_map[get_ref_frame_map_idx(cm, GOLDEN_FRAME)],
        cm->ref_frame_map[get_ref_frame_map_idx(cm, LAST_FRAME)]);
  }

  print_reconstruction_frame(last_frame, current_frame->frame_number,
                             /*do_print=*/0);

  ++current_frame->frame_number;
  cpi->ref_frame_flags = ref_frame_flags_backup;
  if (!frame_is_intra_only(cm)) {
    release_scaled_references(cpi);
  }
}